

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

void duckdb::MinOperation::Combine<duckdb::MinMaxState<duckdb::uhugeint_t>,duckdb::MinOperation>
               (MinMaxState<duckdb::uhugeint_t> *source,MinMaxState<duckdb::uhugeint_t> *target,
               AggregateInputData *param_3)

{
  uint64_t uVar1;
  bool bVar2;
  
  if (source->isset == true) {
    if (target->isset == false) {
      target->isset = source->isset;
    }
    else {
      bVar2 = uhugeint_t::operator>(&target->value,&source->value);
      if (!bVar2) {
        return;
      }
    }
    uVar1 = (source->value).upper;
    (target->value).lower = (source->value).lower;
    (target->value).upper = uVar1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.isset) {
			// source is NULL, nothing to do
			return;
		}
		if (!target.isset) {
			// target is NULL, use source value directly
			target = source;
		} else if (GreaterThan::Operation(target.value, source.value)) {
			target.value = source.value;
		}
	}